

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMultiProcessHandler::CheckGeneratedResourceSpec(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  reference pbVar3;
  ulong uVar4;
  reference ppVar5;
  size_type sVar6;
  ostream *poVar7;
  char *pcVar8;
  string local_a20 [32];
  undefined1 local_a00 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_888 [8];
  string error;
  ostringstream local_848 [8];
  ostringstream cmCTestLog_msg_4;
  string local_6d0 [32];
  ostringstream local_6b0 [8];
  ostringstream cmCTestLog_msg_3;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *test_1;
  iterator __end2;
  iterator __begin2;
  PropertiesMap *__range2;
  string local_510 [32];
  ostringstream local_4f0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_378 [32];
  ostringstream local_358 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *test;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  cmCTestMultiProcessHandler *this_local;
  
  __end1 = std::
           map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ::begin(&(this->Properties).
                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  );
  test = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
         std::
         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
         ::end(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
  while (bVar2 = std::operator!=(&__end1,(_Self *)&test), bVar2) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
             operator*(&__end1);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)&this->ResourceSpecSetupTest);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1b0);
        poVar7 = std::operator<<((ostream *)local_1b0,
                                 "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x613,pcVar8,false);
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::ostringstream::~ostringstream(local_1b0);
        this_local._7_1_ = 0;
        goto LAB_0028500c;
      }
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&ppVar5->second->FixturesSetup);
      if (sVar6 != 1) {
        std::__cxx11::ostringstream::ostringstream(local_358);
        poVar7 = std::operator<<((ostream *)local_358,
                                 "Test that defines GENERATED_RESOURCE_SPEC_FILE must have exactly one FIXTURES_SETUP"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x61b,pcVar8,false);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::ostringstream::~ostringstream(local_358);
        this_local._7_1_ = 0;
        goto LAB_0028500c;
      }
      bVar2 = cmsys::SystemTools::FileIsFullPath(&ppVar5->second->GeneratedResourceSpecFile);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_4f0);
        poVar7 = std::operator<<((ostream *)local_4f0,
                                 "GENERATED_RESOURCE_SPEC_FILE must be an absolute path");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x623,pcVar8,false);
        std::__cxx11::string::~string(local_510);
        std::__cxx11::ostringstream::~ostringstream(local_4f0);
        this_local._7_1_ = 0;
        goto LAB_0028500c;
      }
      std::optional<unsigned_long>::operator=(&this->ResourceSpecSetupTest,&ppVar5->first);
      __range2 = (PropertiesMap *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&ppVar5->second->FixturesSetup);
      pbVar3 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&__range2);
      std::__cxx11::string::operator=((string *)&this->ResourceSpecSetupFixture,(string *)pbVar3);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
    operator++(&__end1);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    __end2 = std::
             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ::begin(&(this->Properties).
                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    );
    test_1 = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
             std::
             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ::end(&(this->Properties).
                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  );
    while (bVar2 = std::operator!=(&__end2,(_Self *)&test_1), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>
               ::operator*(&__end2);
      bVar2 = std::
              vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
              ::empty(&ppVar5->second->ResourceGroups);
      if ((!bVar2) &&
         (sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&ppVar5->second->FixturesRequired,&this->ResourceSpecSetupFixture),
         sVar6 == 0)) {
        std::__cxx11::ostringstream::ostringstream(local_6b0);
        poVar7 = std::operator<<((ostream *)local_6b0,
                                 "All tests that have RESOURCE_GROUPS must include the resource spec generator fixture in their FIXTURES_REQUIRED"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x634,pcVar8,false);
        std::__cxx11::string::~string(local_6d0);
        std::__cxx11::ostringstream::~ostringstream(local_6b0);
        this_local._7_1_ = 0;
        goto LAB_0028500c;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
      operator++(&__end2);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = std::optional::operator_cast_to_bool((optional *)&this->ResourceSpecSetupTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_848);
      poVar7 = std::operator<<((ostream *)local_848,
                               "GENERATED_RESOURCE_SPEC_FILE test property cannot be used in conjunction with ResourceSpecFile option"
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x63f,pcVar8,false);
      std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_848);
      this_local._7_1_ = 0;
      goto LAB_0028500c;
    }
    std::__cxx11::string::string((string *)local_888);
    bVar2 = InitResourceAllocator(this,(string *)local_888);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
      poVar7 = std::operator<<((ostream *)local_a00,(string *)local_888);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x644,pcVar8,false);
      std::__cxx11::string::~string(local_a20);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_888);
    if (!bVar2) goto LAB_0028500c;
  }
  this_local._7_1_ = 1;
LAB_0028500c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::CheckGeneratedResourceSpec()
{
  for (auto& test : this->Properties) {
    if (!test.second->GeneratedResourceSpecFile.empty()) {
      if (this->ResourceSpecSetupTest) {
        cmCTestLog(
          this->CTest, ERROR_MESSAGE,
          "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property"
            << std::endl);
        return false;
      }

      if (test.second->FixturesSetup.size() != 1) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Test that defines GENERATED_RESOURCE_SPEC_FILE must have "
                   "exactly one FIXTURES_SETUP"
                     << std::endl);
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(
            test.second->GeneratedResourceSpecFile)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "GENERATED_RESOURCE_SPEC_FILE must be an absolute path"
                     << std::endl);
        return false;
      }

      this->ResourceSpecSetupTest = test.first;
      this->ResourceSpecSetupFixture = *test.second->FixturesSetup.begin();
    }
  }

  if (!this->ResourceSpecSetupFixture.empty()) {
    for (auto& test : this->Properties) {
      if (!test.second->ResourceGroups.empty() &&
          !test.second->FixturesRequired.count(
            this->ResourceSpecSetupFixture)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "All tests that have RESOURCE_GROUPS must include the "
                   "resource spec generator fixture in their FIXTURES_REQUIRED"
                     << std::endl);
        return false;
      }
    }
  }

  if (!this->ResourceSpecFile.empty()) {
    if (this->ResourceSpecSetupTest) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "GENERATED_RESOURCE_SPEC_FILE test property cannot be used "
                 "in conjunction with ResourceSpecFile option"
                   << std::endl);
      return false;
    }
    std::string error;
    if (!this->InitResourceAllocator(error)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, error << std::endl);
      return false;
    }
  }

  return true;
}